

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall
jpge::jpeg_encoder::emit_dht(jpeg_encoder *this,uint8 *bits,uint8 *val,int index,bool ac_flag)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  uint uVar6;
  undefined8 in_RAX;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  emit_marker(this,0xc4);
  lVar7 = 0;
  iVar9 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  do {
    uVar1 = *(undefined4 *)(bits + lVar7 + 1);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar8;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar8;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar5._5_8_ = 0;
    auVar5._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar8;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar5 << 0x40,6);
    iVar9 = iVar9 + (int)uVar8;
    iVar11 = iVar11 + auVar4._4_4_;
    iVar12 = iVar12 + auVar3._8_4_;
    iVar13 = iVar13 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  uVar10 = iVar13 + iVar11 + iVar12 + iVar9;
  emit_word(this,uVar10 + 0x13);
  uStack_38._0_6_ = CONCAT15(ac_flag * '\x10' + (char)index,(undefined5)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    uVar6 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 5,1);
  }
  else {
    uVar6 = 0;
  }
  this->m_all_stream_writes_succeeded = SUB41(uVar6,0);
  lVar7 = 0;
  do {
    uStack_38._0_7_ = CONCAT16(bits[lVar7 + 1],(undefined6)uStack_38);
    if ((uVar6 & 1) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
    }
    this->m_all_stream_writes_succeeded = SUB41(uVar6,0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  if (uVar10 != 0) {
    uVar8 = 0;
    do {
      uStack_38 = CONCAT17(val[uVar8],(undefined7)uStack_38);
      if ((uVar6 & 1) == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
      }
      this->m_all_stream_writes_succeeded = SUB41(uVar6,0);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dht(uint8 *bits, uint8 *val, int index, bool ac_flag)
{
  emit_marker(M_DHT);

  int length = 0;
  for (int i = 1; i <= 16; i++)
    length += bits[i];

  emit_word(length + 2 + 1 + 16);
  emit_byte(static_cast<uint8>(index + (ac_flag << 4)));

  for (int i = 1; i <= 16; i++)
    emit_byte(bits[i]);

  for (int i = 0; i < length; i++)
    emit_byte(val[i]);
}